

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteBoolArray
               (bool *a,int n,CodedOutputStream *output)

{
  uint8_t *puVar1;
  
  puVar1 = output->cur_;
  if ((long)(output->impl_).end_ - (long)puVar1 < (long)n) {
    puVar1 = io::EpsCopyOutputStream::WriteRawFallback(&output->impl_,a,n,puVar1);
  }
  else {
    memcpy(puVar1,a,(ulong)(uint)n);
    puVar1 = puVar1 + n;
  }
  output->cur_ = puVar1;
  return;
}

Assistant:

void WireFormatLite::WriteBoolArray(const bool* a, int n,
                                    io::CodedOutputStream* output) {
  WriteArray<bool>(a, n, output);
}